

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialization_pipeline<ExtIsoForest,char_const*>(ExtIsoForest *model,char **in)

{
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ExtIsoForest *in_RDI;
  size_t jump_ahead;
  uint8_t ending_type;
  bool diff_endian;
  vector<char,_std::allocator<char>_> buffer;
  size_t size_model;
  uint8_t model_in;
  uint8_t model_type;
  bool lacks_indexer;
  bool lacks_scoring_metric;
  bool lacks_range_penalty;
  PlatformEndianness saved_endian;
  PlatformSize saved_size_t;
  PlatformSize saved_int_t;
  bool has_same_endianness;
  bool has_same_size_t_size;
  bool has_same_int_size;
  SignalSwitcher ss;
  vector<char,_std::allocator<char>_> *buffer_00;
  SignalSwitcher *in_stack_fffffffffffffde0;
  SignalSwitcher *this_00;
  undefined1 *n_els;
  SignalSwitcher *ss_00;
  allocator<char> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined8 in_stack_fffffffffffffe28;
  int __val;
  undefined6 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe56;
  undefined1 in_stack_fffffffffffffe57;
  PlatformSize *in_stack_fffffffffffffe58;
  bool *in_stack_fffffffffffffe60;
  char **in_stack_fffffffffffffe68;
  ExtIsoForest *in_stack_fffffffffffffe70;
  char **in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe8d;
  undefined1 in_stack_fffffffffffffe8e;
  undefined1 in_stack_fffffffffffffe8f;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  char **in_stack_fffffffffffffe98;
  ExtIsoForest *in_stack_fffffffffffffea0;
  PlatformEndianness *in_stack_fffffffffffffeb0;
  bool *in_stack_fffffffffffffeb8;
  bool *in_stack_fffffffffffffec0;
  bool *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_111 [4];
  string local_90 [39];
  byte local_69;
  uint8_t local_46;
  uint8_t local_45;
  undefined1 local_33 [3];
  vector<char,_std::allocator<char>_> local_30;
  ExtIsoForest *local_8;
  
  __val = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_8 = in_RDI;
  SignalSwitcher::SignalSwitcher(in_stack_fffffffffffffde0);
  ss_00 = (SignalSwitcher *)local_33;
  n_els = local_33 + 1;
  this_00 = (SignalSwitcher *)(local_33 + 2);
  buffer_00 = &local_30;
  check_setup_info<char_const*>
            (in_stack_fffffffffffffe78,(bool *)in_stack_fffffffffffffe70,
             (bool *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (PlatformSize *)
             CONCAT17(in_stack_fffffffffffffe57,
                      CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
             in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffec8);
  local_45 = get_model_code(local_8);
  read_bytes<unsigned_char>(this_00,(size_t)buffer_00,(char **)0x64c26b);
  if (local_45 != local_46) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"Object to de-serialize does not match with the supplied type.\n");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((((local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._15_1_ & 1) == 0) ||
       ((local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._14_1_ & 1) == 0)) ||
      ((local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._13_1_ & 1) == 0)) ||
     (((local_33[2] & 1) != 0 || ((local_33[1] & 1) != 0)))) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x64c370);
    local_69 = (local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._13_1_ ^ 0xff) & 1;
    if ((local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._8_4_ == 1) &&
       (local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._4_4_ == 2)) {
      read_bytes<unsigned_long,unsigned_int>(ss_00,(size_t)n_els,(char **)this_00,buffer_00,false);
      deserialize_model<char_const*,short,unsigned_int>
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 (bool)in_stack_fffffffffffffe8f,(bool)in_stack_fffffffffffffe8e,
                 (bool)in_stack_fffffffffffffe8d);
    }
    else if ((local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._8_4_ == 2) &&
            (local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._4_4_ == 2)) {
      read_bytes<unsigned_long,unsigned_int>(ss_00,(size_t)n_els,(char **)this_00,buffer_00,false);
      deserialize_model<char_const*,int,unsigned_int>
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 (bool)in_stack_fffffffffffffe8f,(bool)in_stack_fffffffffffffe8e,
                 (bool)in_stack_fffffffffffffe8d);
    }
    else if ((local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._8_4_ == 3) &&
            (local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._4_4_ == 2)) {
      read_bytes<unsigned_long,unsigned_int>(ss_00,(size_t)n_els,(char **)this_00,buffer_00,false);
      deserialize_model<char_const*,long,unsigned_int>
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 (bool)in_stack_fffffffffffffe8f,(bool)in_stack_fffffffffffffe8e,
                 (bool)in_stack_fffffffffffffe8d);
    }
    else if ((local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._8_4_ == 1) &&
            (local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._4_4_ == 3)) {
      read_bytes<unsigned_long,unsigned_long>(ss_00,(size_t)n_els,(char **)this_00,buffer_00,false);
      deserialize_model<char_const*,short,unsigned_long>
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 (bool)in_stack_fffffffffffffe8f,(bool)in_stack_fffffffffffffe8e,
                 (bool)in_stack_fffffffffffffe8d);
    }
    else if ((local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._8_4_ == 2) &&
            (local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._4_4_ == 3)) {
      read_bytes<unsigned_long,unsigned_long>(ss_00,(size_t)n_els,(char **)this_00,buffer_00,false);
      deserialize_model<char_const*,int,unsigned_long>
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 (bool)in_stack_fffffffffffffe8f,(bool)in_stack_fffffffffffffe8e,
                 (bool)in_stack_fffffffffffffe8d);
    }
    else {
      if ((local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._8_4_ != 3) ||
         (local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl._4_4_ != 3)) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x10);
        this_01 = local_111;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_01,(char *)__lhs,in_stack_fffffffffffffe10);
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &stack0xfffffffffffffec7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_01,(char *)__lhs,(allocator<char> *)__rhs);
        std::operator+(__lhs,__rhs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_01,(char *)__lhs,(allocator<char> *)__rhs);
        std::operator+(__lhs,__rhs);
        std::__cxx11::to_string(__val);
        std::operator+(__lhs,__rhs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_01,(char *)__lhs,(allocator<char> *)__rhs);
        std::operator+(__lhs,__rhs);
        std::runtime_error::runtime_error((runtime_error *)__lhs,local_90);
        __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      read_bytes<unsigned_long,unsigned_long>(ss_00,(size_t)n_els,(char **)this_00,buffer_00,false);
      deserialize_model<char_const*,long,unsigned_long>
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 (bool)in_stack_fffffffffffffe8f,(bool)in_stack_fffffffffffffe8e,
                 (bool)in_stack_fffffffffffffe8d);
    }
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)ss_00);
  }
  else {
    read_bytes<unsigned_long>(this_00,(size_t)buffer_00,(char **)0x64c347);
    deserialize_model<char_const*>(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  }
  check_interrupt_switch(ss_00);
  if ((local_33[2] & 1) != 0) {
    add_range_penalty((ExtIsoForest *)0x64ca8b);
    check_interrupt_switch(ss_00);
  }
  read_bytes<unsigned_char>(this_00,(size_t)buffer_00,(char **)0x64cab3);
  read_bytes<unsigned_long>(this_00,(size_t)buffer_00,(char **)0x64caca);
  SignalSwitcher::~SignalSwitcher(this_00);
  return;
}

Assistant:

void deserialization_pipeline(Model &model, itype &in)
{
    SignalSwitcher ss = SignalSwitcher();

    bool has_same_int_size;
    bool has_same_size_t_size;
    bool has_same_endianness;
    PlatformSize saved_int_t;
    PlatformSize saved_size_t;
    PlatformEndianness saved_endian;
    bool lacks_range_penalty;
    bool lacks_scoring_metric;
    bool lacks_indexer; /* <- ignored */

    check_setup_info(
        in,
        has_same_int_size,
        has_same_size_t_size,
        has_same_endianness,
        saved_int_t,
        saved_size_t,
        saved_endian,
        lacks_range_penalty,
        lacks_scoring_metric,
        lacks_indexer
    );

    uint8_t model_type = get_model_code(model);
    uint8_t model_in;
    read_bytes<uint8_t>((void*)&model_in, (size_t)1, in);
    if (model_type != model_in)
        throw std::runtime_error("Object to de-serialize does not match with the supplied type.\n");

    size_t size_model;
    if (has_same_int_size && has_same_size_t_size && has_same_endianness && !lacks_range_penalty && !lacks_scoring_metric)
    {
        read_bytes<size_t>((void*)&size_model, (size_t)1, in);
        deserialize_model(model, in);
    }
    
    else
    {
        std::vector<char> buffer;
        const bool diff_endian = !has_same_endianness;

        if (saved_int_t == Is16Bit && saved_size_t == Is32Bit)
        {
            read_bytes<size_t, uint32_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int16_t, uint32_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is32Bit && saved_size_t == Is32Bit)
        {
            read_bytes<size_t, uint32_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int32_t, uint32_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is64Bit && saved_size_t == Is32Bit)
        {
            read_bytes<size_t, uint32_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int64_t, uint32_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is16Bit && saved_size_t == Is64Bit)
        {
            read_bytes<size_t, uint64_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int16_t, uint64_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is32Bit && saved_size_t == Is64Bit)
        {
            read_bytes<size_t, uint64_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int32_t, uint64_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else if (saved_int_t == Is64Bit && saved_size_t == Is64Bit)
        {
            read_bytes<size_t, uint64_t>((void*)&size_model, (size_t)1, in, buffer, diff_endian);
            deserialize_model<itype, int64_t, uint64_t>(model, in, buffer, diff_endian, lacks_range_penalty, lacks_scoring_metric);
        }

        else
        {
            unexpected_error();
        }
    }

    check_interrupt_switch(ss);

    if (lacks_range_penalty)
    {
        add_range_penalty(model);
        check_interrupt_switch(ss);
    }

    /* Not currently used, but left in case the format changes */
    uint8_t ending_type;
    read_bytes<uint8_t>((void*)&ending_type, (size_t)1, in);
    size_t jump_ahead;
    read_bytes<size_t>((void*)&jump_ahead, (size_t)1, in);
}